

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minSelect(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int *nr,
           number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *val,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *stab,
           number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *bestDelta,
           number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *max)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  int i;
  int i_00;
  DataKey DVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  best;
  
  ::soplex::infinity::__tls_init();
  best.m_backend.fpclass = cpp_dec_float_finite;
  best.m_backend.prec_elem = 0x10;
  best.m_backend.data._M_elems[0] = 0;
  best.m_backend.data._M_elems[1] = 0;
  best.m_backend.data._M_elems[2] = 0;
  best.m_backend.data._M_elems[3] = 0;
  best.m_backend.data._M_elems[4] = 0;
  best.m_backend.data._M_elems[5] = 0;
  best.m_backend.data._M_elems[6] = 0;
  best.m_backend.data._M_elems[7] = 0;
  best.m_backend.data._M_elems[8] = 0;
  best.m_backend.data._M_elems[9] = 0;
  best.m_backend.data._M_elems[10] = 0;
  best.m_backend.data._M_elems[0xb] = 0;
  best.m_backend.data._M_elems[0xc] = 0;
  best.m_backend.data._M_elems[0xd] = 0;
  best.m_backend.data._M_elems._56_5_ = 0;
  best.m_backend.data._M_elems[0xf]._1_3_ = 0;
  best.m_backend.exp = 0;
  best.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&best,*(double *)(in_FS_OFFSET + -8));
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)bestDelta,0.0);
  this->iscoid = true;
  local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(max->m_backend).data._M_elems;
  local_d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 2);
  local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 4);
  local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 6);
  local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 8);
  local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 10);
  local_d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 0xc);
  local_d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 0xe);
  local_d8.m_backend.exp = (max->m_backend).exp;
  local_d8.m_backend.neg = (max->m_backend).neg;
  local_d8.m_backend.fpclass = (max->m_backend).fpclass;
  local_d8.m_backend.prec_elem = (max->m_backend).prec_elem;
  pSVar1 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  i = minSelect(this,val,stab,&best,bestDelta,&local_d8,pSVar1->theCoPvec,pSVar1->theCoLbound,
                pSVar1->theCoUbound,0,1);
  this->iscoid = false;
  local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(max->m_backend).data._M_elems;
  local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 2);
  local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 4);
  local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 6);
  local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 8);
  local_128.m_backend.data._M_elems._40_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 10);
  local_128.m_backend.data._M_elems._48_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 0xc);
  local_128.m_backend.data._M_elems._56_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 0xe);
  local_128.m_backend.exp = (max->m_backend).exp;
  local_128.m_backend.neg = (max->m_backend).neg;
  local_128.m_backend.fpclass = (max->m_backend).fpclass;
  local_128.m_backend.prec_elem = (max->m_backend).prec_elem;
  pSVar1 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  i_00 = minSelect(this,val,stab,&best,bestDelta,&local_128,pSVar1->thePvec,pSVar1->theLbound,
                   pSVar1->theUbound,0,1);
  if (i_00 < 0) {
    uVar3 = 0xffffffff00000000;
    if (i < 0) {
      *nr = -1;
      DVar2.info = 0;
      DVar2.idx = 0;
      goto LAB_00485b05;
    }
    *nr = i;
    DVar2 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::coId((this->
                            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).thesolver,i);
  }
  else {
    *nr = i_00;
    DVar2 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::id((this->
                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).thesolver,i_00);
  }
  uVar3 = (ulong)DVar2 & 0xffffffff00000000;
LAB_00485b05:
  return (SPxId)((ulong)DVar2 & 0xffffffff | uVar3);
}

Assistant:

SPxId SPxFastRT<R>::minSelect(
   int& nr,
   R& val,
   R& stab,
   R& bestDelta,
   R max)
{
   R best = R(infinity);
   bestDelta = 0.0;
   iscoid = true;
   int indc = minSelect(val, stab, best, bestDelta, max,
                        this->thesolver->coPvec(), this->thesolver->lcBound(), this->thesolver->ucBound(), 0, 1);
   iscoid = false;
   int indp = minSelect(val, stab, best, bestDelta, max,
                        this->thesolver->pVec(), this->thesolver->lpBound(), this->thesolver->upBound(), 0, 1);

   if(indp >= 0)
   {
      nr = indp;
      return this->thesolver->id(indp);
   }

   if(indc >= 0)
   {
      nr = indc;
      return this->thesolver->coId(indc);
   }

   nr = -1;
   return SPxId();
}